

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void g_readwrite_setup(void)

{
  _class *p_Var1;
  t_symbol *ptVar2;
  
  savestate_setup();
  p_Var1 = canvas_class;
  ptVar2 = gensym("write");
  class_addmethod(p_Var1,glist_write,ptVar2,A_SYMBOL,7,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("read");
  class_addmethod(p_Var1,glist_read,ptVar2,A_SYMBOL,7,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("mergefile");
  class_addmethod(p_Var1,glist_mergefile,ptVar2,A_SYMBOL,7,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("savetofile");
  class_addmethod(p_Var1,canvas_savetofile,ptVar2,A_SYMBOL,2,6,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("saveto");
  class_addmethod(p_Var1,canvas_saveto,ptVar2,A_CANT,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("saved");
  class_addmethod(p_Var1,canvas_saved,ptVar2,A_GIMME,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("menusave");
  class_addmethod(p_Var1,canvas_menusave,ptVar2,A_DEFFLOAT,0);
  p_Var1 = canvas_class;
  ptVar2 = gensym("menusaveas");
  class_addmethod(p_Var1,canvas_menusaveas,ptVar2,A_DEFFLOAT,0);
  return;
}

Assistant:

void g_readwrite_setup(void)
{
    savestate_setup();
    class_addmethod(canvas_class, (t_method)glist_write,
        gensym("write"), A_SYMBOL, A_DEFSYM, A_NULL);
    class_addmethod(canvas_class, (t_method)glist_read,
        gensym("read"), A_SYMBOL, A_DEFSYM, A_NULL);
    class_addmethod(canvas_class, (t_method)glist_mergefile,
        gensym("mergefile"), A_SYMBOL, A_DEFSYM, A_NULL);
    class_addmethod(canvas_class, (t_method)canvas_savetofile,
        gensym("savetofile"), A_SYMBOL, A_SYMBOL, A_DEFFLOAT, 0);
    class_addmethod(canvas_class, (t_method)canvas_saveto,
        gensym("saveto"), A_CANT, 0);
    class_addmethod(canvas_class, (t_method)canvas_saved,
        gensym("saved"), A_GIMME, 0);
/* ------------------ from the menu ------------------------- */
    class_addmethod(canvas_class, (t_method)canvas_menusave,
        gensym("menusave"), A_DEFFLOAT, 0);
    class_addmethod(canvas_class, (t_method)canvas_menusaveas,
        gensym("menusaveas"), A_DEFFLOAT, 0);
}